

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cc
# Opt level: O1

string * bssl::anon_unknown_22::StrSetToString
                   (string *__return_storage_ptr__,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *str_set)

{
  _Base_ptr p_Var1;
  pointer *__ptr;
  char *in_R9;
  _Rb_tree_header *p_Var2;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string local_58;
  AssertHelper local_38;
  
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (str_set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(str_set->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_70[0] = (internal)(p_Var1[1]._M_parent != (_Base_ptr)0x0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_70[0]) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_58,local_70,(AssertionResult *)0x550efc,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/test_helpers.cc"
                   ,0x4b,local_58._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (local_78._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_78._M_head_impl + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      if (__return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var1 + 1));
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrSetToString(const std::set<std::string> &str_set) {
  std::string out;
  for (const auto &s : str_set) {
    EXPECT_FALSE(s.empty());
    if (!out.empty()) {
      out += ", ";
    }
    out += s;
  }
  return out;
}